

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

void prometheus::(anonymous_namespace)::
     CollectAll<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>>
               (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *results
               ,vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
                *families)

{
  bool bVar1;
  pointer pFVar2;
  iterator iVar3;
  move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
  __last;
  __normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
  local_60;
  const_iterator local_58;
  undefined1 local_50 [8];
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
  *collectable;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
  *__range2;
  vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
  *families_local;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *results_local;
  
  __end0 = std::
           vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
           ::begin(families);
  collectable = (unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
                 *)std::
                   vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
                   ::end(families);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>_>
                                *)&collectable);
    if (!bVar1) break;
    metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>_>
                  ::operator*(&__end0);
    pFVar2 = std::
             unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
             ::operator->((unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
                           *)metrics.
                             super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*(pFVar2->super_Collectable)._vptr_Collectable[2])();
    local_60._M_current =
         (MetricFamily *)
         std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::end
                   (results);
    __gnu_cxx::
    __normal_iterator<prometheus::MetricFamily_const*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>
    ::__normal_iterator<prometheus::MetricFamily*>
              ((__normal_iterator<prometheus::MetricFamily_const*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>
                *)&local_58,&local_60);
    iVar3 = std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::begin
                      ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                        *)local_50);
    __first = std::
              make_move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>
                        ((__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
                          )iVar3._M_current);
    iVar3 = std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::end
                      ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                        *)local_50);
    __last = std::
             make_move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>
                       ((__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
                         )iVar3._M_current);
    std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>,void>
              ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)results,
               local_58,__first,__last);
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
              ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
               local_50);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void CollectAll(std::vector<MetricFamily>& results, const T& families) {
  for (auto&& collectable : families) {
    auto metrics = collectable->Collect();
    results.insert(results.end(), std::make_move_iterator(metrics.begin()),
                   std::make_move_iterator(metrics.end()));
  }
}